

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * call_function(Scope *scope,FunctionValue *function_value,TupleValue *parameter_values)

{
  Scope *scope_00;
  Value *result;
  size_t i;
  Value *variable_value;
  Scope *function_scope;
  TupleValue *parameter_values_local;
  FunctionValue *function_value_local;
  Scope *scope_local;
  
  scope_00 = new_scope(scope,function_value->block,ScopeTypeFunctionScope);
  if (function_value->argument_count < parameter_values->length) {
    scope_local = (Scope *)new_null_value();
  }
  else {
    for (result = (Value *)0x0; result < (Value *)function_value->argument_count;
        result = (Value *)((long)&result->value_type + 1)) {
      if (result < (Value *)parameter_values->length) {
        i = (size_t)parameter_values->items[(long)result];
      }
      else {
        i = (size_t)new_null_value();
      }
      scope_set_variable(scope_00,ValueTypeNullValue,function_value->arguments[(long)result],
                         (Value *)i,1);
    }
    scope_local = (Scope *)evaluate_scope(scope_00);
    free_scope(scope_00);
  }
  return (Value *)scope_local;
}

Assistant:

Value *call_function(Scope *scope, FunctionValue *function_value, TupleValue *parameter_values) {
  Scope *function_scope = new_scope(scope, function_value->block, ScopeTypeFunctionScope);

  if (parameter_values->length > function_value->argument_count) return new_null_value();

  Value *variable_value;

  for (size_t i = 0; i < function_value->argument_count; i++) {
    if (parameter_values->length <= i) {
      variable_value = new_null_value();
    }
    else {
      variable_value = parameter_values->items[i];
    }

    scope_set_variable(function_scope, ValueTypeNullValue, function_value->arguments[i], variable_value, true);
  }

  Value *result = evaluate_scope(function_scope);
  free_scope(function_scope);

  return result;
}